

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O0

void __thiscall amrex::MLCellLinOp::updateSolBC(MLCellLinOp *this,int amrlev,MultiFab *crse_bcdata)

{
  int num_comp;
  pointer this_00;
  int in_ESI;
  BndryRegister *in_RDI;
  Periodicity PVar1;
  int ncomp;
  char *in_stack_00000188;
  int in_stack_00000194;
  char *in_stack_00000198;
  char *in_stack_000001a0;
  size_type in_stack_ffffffffffffff68;
  BndryRegister **i;
  Vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
  *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  BndryRegister *crse;
  int iVar2;
  undefined4 in_stack_ffffffffffffffb4;
  BndryRegister *local_48;
  int max_order;
  
  if (in_ESI < 1) {
    Assert_host(in_stack_000001a0,in_stack_00000198,in_stack_00000194,in_stack_00000188);
  }
  num_comp = (**(code **)(*(long *)&in_RDI->_vptr_BndryRegister + 0x28))();
  Vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
  ::operator[](in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  this_00 = std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>::
            operator->((unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>
                        *)0x151d21b);
  Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                *)this_00,in_stack_ffffffffffffff68);
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
            ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)this_00,
             in_stack_ffffffffffffff68);
  PVar1 = Geometry::periodicity((Geometry *)in_RDI);
  crse = PVar1.period.vect._0_8_;
  iVar2 = PVar1.period.vect[2];
  i = &local_48;
  local_48 = crse;
  max_order = iVar2;
  BndryRegister::copyFrom
            (in_RDI,(MultiFab *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),(int)in_stack_ffffffffffffff90,
             (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)in_stack_ffffffffffffff88,
             (Periodicity *)CONCAT44(in_stack_ffffffffffffffb4,iVar2));
  Vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
                *)this_00,(size_type)i);
  std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>::operator->
            ((unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_> *)0x151d2bf);
  Vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
                *)this_00,(size_type)i);
  std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>::operator*
            ((unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_> *)this_00
            );
  Vector<int,_std::allocator<int>_>::operator[]
            ((Vector<int,_std::allocator<int>_> *)this_00,(size_type)i);
  InterpBndryData::updateBndryValues
            ((InterpBndryData *)CONCAT44(in_stack_ffffffffffffffb4,iVar2),crse,
             (int)((ulong)in_RDI >> 0x20),(int)in_RDI,num_comp,in_stack_ffffffffffffff98,max_order);
  return;
}

Assistant:

void
MLCellLinOp::updateSolBC (int amrlev, const MultiFab& crse_bcdata) const
{
    BL_PROFILE("MLCellLinOp::updateSolBC()");

    AMREX_ALWAYS_ASSERT(amrlev > 0);
    const int ncomp = getNComp();
    m_crse_sol_br[amrlev]->copyFrom(crse_bcdata, 0, 0, 0, ncomp, m_geom[amrlev-1][0].periodicity());
    m_bndry_sol[amrlev]->updateBndryValues(*m_crse_sol_br[amrlev], 0, 0, ncomp, m_amr_ref_ratio[amrlev-1]);
}